

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O1

void __thiscall brown::Tile::drawhlin(Tile *this,int x0,int x1,int y,uint32_t col)

{
  int iVar1;
  uintptr_t uVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((uint)y < (uint)this->y) {
    uVar4 = 0;
    if (0 < x0) {
      uVar4 = x0;
    }
    if (this->x < x1) {
      x1 = this->x;
    }
    if ((int)uVar4 < x1) {
      iVar1 = this->p;
      uVar2 = this->f;
      uVar3 = (ulong)uVar4;
      do {
        *(uint32_t *)((long)y * (long)iVar1 + uVar2 + uVar3 * 4) = col;
        uVar3 = uVar3 + 1;
      } while ((uint)x1 != uVar3);
    }
  }
  return;
}

Assistant:

void Tile::drawhlin (int x0, int x1, int y, std::uint32_t col)
{
    int x;
    std::uint32_t *lptr;

    if ((unsigned)y >= (unsigned)this->y) return;
    x0 = max(x0,0); x1 = min(x1,this->x); if (x0 >= x1) return;
    lptr = (std::uint32_t *)(this->p*y + this->f);
    for(x=x0;x<x1;x++) lptr[x] = col;
}